

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BerdyHelper.cpp
# Opt level: O0

bool __thiscall iDynTree::BerdyHelper::initOriginalBerdyFixedBase(BerdyHelper *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  long *plVar5;
  ostream *poVar6;
  char *pcVar7;
  SensorType *pSVar8;
  ulong uVar9;
  long lVar10;
  long in_RDI;
  size_t nrOfDynamicVariablesForDOFs;
  size_t nrOfDOFs;
  stringstream ss_1;
  LinkIndex linkToWhichTheSensorIsAttached;
  LinkSensor *linkSensor;
  size_t sensIdx;
  SensorType type;
  stringstream ss;
  JointIndex jntIdx;
  long *local_460;
  string local_3f8 [32];
  string local_3d8 [32];
  string local_3b8 [32];
  stringstream local_398 [16];
  ostream local_388 [256];
  BerdyHelper *in_stack_fffffffffffffd78;
  ulong local_200;
  SensorType local_1f4;
  string local_1f0 [32];
  string local_1d0 [48];
  stringstream local_1a0 [16];
  ostream local_190 [376];
  long local_18;
  byte local_1;
  
  local_18 = 0;
  do {
    lVar10 = local_18;
    lVar4 = iDynTree::Model::getNrOfJoints();
    if (lVar4 <= lVar10) {
      for (local_1f4 = SIX_AXIS_FORCE_TORQUE; (int)local_1f4 < 5;
          local_1f4 = local_1f4 + ACCELEROMETER) {
        bVar1 = isLinkSensor(local_1f4);
        if (bVar1) {
          local_200 = 0;
          while( true ) {
            pSVar8 = (SensorType *)iDynTree::Model::sensors();
            uVar9 = iDynTree::SensorsList::getNrOfSensors(pSVar8);
            if (uVar9 <= local_200) break;
            pSVar8 = (SensorType *)iDynTree::Model::sensors();
            lVar10 = iDynTree::SensorsList::getSensor(pSVar8,(long)&local_1f4);
            if (lVar10 == 0) {
              local_460 = (long *)0x0;
            }
            else {
              local_460 = (long *)__dynamic_cast(lVar10,&Sensor::typeinfo,&LinkSensor::typeinfo,0);
            }
            lVar10 = (**(code **)(*local_460 + 0x50))();
            iDynTree::Traversal::getBaseLink();
            lVar4 = iDynTree::Link::getIndex();
            if (lVar10 == lVar4) {
              std::__cxx11::stringstream::stringstream(local_398);
              poVar6 = std::operator<<(local_388,"Sensor ");
              (**(code **)(*local_460 + 0x10))(local_3b8);
              poVar6 = std::operator<<(poVar6,local_3b8);
              poVar6 = std::operator<<(poVar6," is attached to link ");
              iDynTree::Model::getLinkName_abi_cxx11_((long)local_3d8);
              poVar6 = std::operator<<(poVar6,local_3d8);
              std::operator<<(poVar6,
                              " but this link is the base link and base link sensors are not supported by the original berdy."
                             );
              std::__cxx11::string::~string(local_3d8);
              std::__cxx11::string::~string(local_3b8);
              std::__cxx11::stringstream::str();
              pcVar7 = (char *)std::__cxx11::string::c_str();
              iDynTree::reportError("BerdyHelpers","init",pcVar7);
              std::__cxx11::string::~string(local_3f8);
              local_1 = 0;
              std::__cxx11::stringstream::~stringstream(local_398);
              goto LAB_0051efd1;
            }
            local_200 = local_200 + 1;
          }
        }
      }
      lVar10 = iDynTree::Model::getNrOfDOFs();
      iVar2 = 0x14;
      if ((*(byte *)(in_RDI + 0x1b4) & 1) != 0) {
        iVar2 = 0x1a;
      }
      *(long *)(in_RDI + 0x1f8) = iVar2 * lVar10;
      *(long *)(in_RDI + 0x200) = lVar10 * 0x13;
      initSensorsMeasurements(in_stack_fffffffffffffd78);
      local_1 = 1;
LAB_0051efd1:
      return (bool)(local_1 & 1);
    }
    plVar5 = (long *)iDynTree::Model::getJoint(in_RDI);
    iVar2 = (**(code **)(*plVar5 + 0x20))();
    if (iVar2 != 1) {
      std::__cxx11::stringstream::stringstream(local_1a0);
      poVar6 = std::operator<<(local_190,"Joint ");
      iDynTree::Model::getJointName_abi_cxx11_((long)local_1d0);
      poVar6 = std::operator<<(poVar6,local_1d0);
      poVar6 = std::operator<<(poVar6," has ");
      plVar5 = (long *)iDynTree::Model::getJoint(in_RDI);
      uVar3 = (**(code **)(*plVar5 + 0x20))();
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar3);
      std::operator<<(poVar6,
                      " DOFs , but the original fixed base formulation of berdy only supports 1 dof frames"
                     );
      std::__cxx11::string::~string(local_1d0);
      std::__cxx11::stringstream::str();
      pcVar7 = (char *)std::__cxx11::string::c_str();
      iDynTree::reportError("BerdyHelpers","init",pcVar7);
      std::__cxx11::string::~string(local_1f0);
      local_1 = 0;
      std::__cxx11::stringstream::~stringstream(local_1a0);
      goto LAB_0051efd1;
    }
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

bool BerdyHelper::initOriginalBerdyFixedBase()
{
    // Check that all joints have 1 dof
    for(JointIndex jntIdx = 0; jntIdx < static_cast<JointIndex>(m_model.getNrOfJoints()); jntIdx++)
    {
        if( m_model.getJoint(jntIdx)->getNrOfDOFs() != 1 )
        {
            std::stringstream ss;
            ss << "Joint " << m_model.getJointName(jntIdx) << " has " << m_model.getJoint(jntIdx)->getNrOfDOFs() << " DOFs , but the original fixed base formulation of berdy only supports 1 dof frames";
            reportError("BerdyHelpers","init",ss.str().c_str());
            return false;
        }
    }

    // Check that no sensors are attached to the base (this is not supported by the original berdy)
    for(SensorType type=SIX_AXIS_FORCE_TORQUE; type < NR_OF_SENSOR_TYPES; type = (SensorType)(type+1))
    {
        // TODO : link sensor are extremly widespared and they have all approximatly the same API,
        //        so we need a better way to iterate over them
        if( isLinkSensor(type) )
        {
            for(size_t sensIdx = 0; sensIdx < m_model.sensors().getNrOfSensors(type); sensIdx++)
            {
                LinkSensor * linkSensor = dynamic_cast<LinkSensor*>(m_model.sensors().getSensor(type,sensIdx));

                LinkIndex   linkToWhichTheSensorIsAttached = linkSensor->getParentLinkIndex();

                if( linkToWhichTheSensorIsAttached == m_dynamicsTraversal.getBaseLink()->getIndex() )
                {
                    std::stringstream ss;
                    ss << "Sensor " << linkSensor->getName() << " is attached to link " << m_model.getLinkName(linkToWhichTheSensorIsAttached) << " but this link is the base link and base link sensors are not supported by the original berdy.";
                    reportError("BerdyHelpers","init",ss.str().c_str());
                    return false;
                }
            }
        }
    }


    // N will be the number of joints/links/dofs
    // We assume that the fixed base is fixed, so we include in the model only N links
    size_t nrOfDOFs = m_model.getNrOfDOFs();

    // In the classical Berdy formulation, we have 6*4 + 2*1 dynamical variables
    size_t nrOfDynamicVariablesForDOFs = m_options.includeAllNetExternalWrenchesAsDynamicVariables ? 6*4+2*1 : 6*3+2*1;
    m_nrOfDynamicalVariables = nrOfDynamicVariablesForDOFs*nrOfDOFs;
    // 19 Dynamics equations are considered in the original berdy :
    // 6 for the propagation of 6d acceleration
    // 6 for the computation of the net wrench from acc and vel
    // 6 for the computation of the joint wrench
    // 1 for the torque computations
    m_nrOfDynamicEquations   = (18+1)*nrOfDOFs;

    initSensorsMeasurements();

    return true;
}